

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion.c
# Opt level: O0

int64_t highbd_segmented_frame_error
                  (uint16_t *ref,int ref_stride,uint16_t *dst,int dst_stride,int p_width,
                  int p_height,int bd,uint8_t *segment_map,int segment_map_stride)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  long in_stack_00000010;
  int seg_y;
  int seg_x;
  int j;
  int i;
  int64_t sum_error;
  int error_bsize_h;
  int error_bsize_w;
  int patch_h;
  int patch_w;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_48;
  int local_44;
  int64_t local_40;
  
  local_54 = in_R8D;
  if (0x1f < in_R8D) {
    local_54 = 0x20;
  }
  local_58 = in_R9D;
  if (0x1f < in_R9D) {
    local_58 = 0x20;
  }
  local_40 = 0;
  for (local_44 = 0; local_44 < in_R9D; local_44 = local_44 + 0x20) {
    for (local_48 = 0; local_48 < in_R8D; local_48 = local_48 + 0x20) {
      if (*(char *)(in_stack_00000010 + ((local_44 >> 5) * seg_y + (local_48 >> 5))) != '\0') {
        if (local_54 < in_R8D - local_48) {
          local_5c = local_54;
        }
        else {
          local_5c = in_R8D - local_48;
        }
        if (local_58 < in_R9D - local_44) {
          local_60 = local_58;
        }
        else {
          local_60 = in_R9D - local_44;
        }
        if ((local_5c == 0x20) && (local_60 == 0x20)) {
          uVar1 = (*aom_highbd_sad32x32)
                            ((uint8_t *)
                             ((ulong)(in_RDI + (long)local_48 * 2 + (long)(local_44 * in_ESI) * 2)
                             >> 1),in_ESI,
                             (uint8_t *)
                             ((ulong)(in_RDX + (long)local_48 * 2 + (long)(local_44 * in_ECX) * 2)
                             >> 1),in_ECX);
          uVar3 = (ulong)uVar1;
        }
        else {
          iVar2 = generic_sad_highbd((uint16_t *)
                                     (in_RDI + (long)local_48 * 2 + (long)(local_44 * in_ESI) * 2),
                                     in_ESI,(uint16_t *)
                                            (in_RDX + (long)local_48 * 2 +
                                            (long)(local_44 * in_ECX) * 2),in_ECX,local_5c,local_60)
          ;
          uVar3 = (ulong)iVar2;
        }
        local_40 = uVar3 + local_40;
      }
    }
  }
  return local_40;
}

Assistant:

static int64_t highbd_segmented_frame_error(
    const uint16_t *const ref, int ref_stride, const uint16_t *const dst,
    int dst_stride, int p_width, int p_height, int bd, uint8_t *segment_map,
    int segment_map_stride) {
  (void)bd;
  int patch_w, patch_h;
  const int error_bsize_w = AOMMIN(p_width, WARP_ERROR_BLOCK);
  const int error_bsize_h = AOMMIN(p_height, WARP_ERROR_BLOCK);
  int64_t sum_error = 0;
  for (int i = 0; i < p_height; i += WARP_ERROR_BLOCK) {
    for (int j = 0; j < p_width; j += WARP_ERROR_BLOCK) {
      int seg_x = j >> WARP_ERROR_BLOCK_LOG;
      int seg_y = i >> WARP_ERROR_BLOCK_LOG;
      // Only compute the error if this block contains inliers from the motion
      // model
      if (!segment_map[seg_y * segment_map_stride + seg_x]) continue;

      // avoid computing error into the frame padding
      patch_w = AOMMIN(error_bsize_w, p_width - j);
      patch_h = AOMMIN(error_bsize_h, p_height - i);

      if (patch_w == WARP_ERROR_BLOCK && patch_h == WARP_ERROR_BLOCK) {
        sum_error += aom_highbd_sad32x32(
            CONVERT_TO_BYTEPTR(ref + j + i * ref_stride), ref_stride,
            CONVERT_TO_BYTEPTR(dst + j + i * dst_stride), dst_stride);
      } else {
        sum_error += generic_sad_highbd(ref + j + i * ref_stride, ref_stride,
                                        dst + j + i * dst_stride, dst_stride,
                                        patch_w, patch_h);
      }
    }
  }
  return sum_error;
}